

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportTryCompileFileGenerator.cxx
# Opt level: O2

string * __thiscall
cmExportTryCompileFileGenerator::FindTargets
          (string *__return_storage_ptr__,cmExportTryCompileFileGenerator *this,string *propName,
          cmGeneratorTarget *tgt,
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *emitted)

{
  Snapshot snapshot;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *psVar1;
  auto_ptr<cmCompiledGeneratorExpression> this_00;
  char *pcVar2;
  string *target;
  cmLocalGenerator *pcVar3;
  _Rb_tree_node_base *p_Var4;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar5;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpression ge;
  cmTarget dummyHead;
  cmGeneratorExpressionDAGChecker dagChecker;
  cmGeneratorTarget gDummyHead;
  allocator local_8f9;
  auto_ptr<cmCompiledGeneratorExpression> local_8f8;
  string *local_8f0;
  string local_8e8;
  cmGeneratorExpression local_8c8;
  Snapshot local_888;
  undefined1 local_870 [32];
  _Base_ptr local_850;
  cmGeneratorExpressionDAGChecker local_5f8;
  cmGeneratorTarget local_530;
  
  pcVar2 = cmGeneratorTarget::GetProperty(tgt,propName);
  if (pcVar2 == (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_8f0 = __return_storage_ptr__;
    cmState::Snapshot::Snapshot(&local_888,(cmState *)0x0);
    local_870._0_8_ = local_870 + 0x10;
    local_870._8_8_ = 0;
    local_870[0x10] = '\0';
    local_850 = (_Base_ptr)0x0;
    snapshot.Position.Tree = local_888.Position.Tree;
    snapshot.State = local_888.State;
    snapshot.Position.Position = local_888.Position.Position;
    cmListFileBacktrace::cmListFileBacktrace
              ((cmListFileBacktrace *)&local_530,snapshot,(cmCommandContext *)local_870);
    cmGeneratorExpression::cmGeneratorExpression(&local_8c8,(cmListFileBacktrace *)&local_530);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&local_530);
    std::__cxx11::string::~string((string *)local_870);
    target = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              (&local_5f8,target,propName,(GeneratorExpressionContent *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&local_530,(char *)&local_8c8);
    local_8f8.x_ = (cmCompiledGeneratorExpression *)local_530.Target;
    local_530.Target = (cmTarget *)0x0;
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&local_530);
    cmTarget::cmTarget((cmTarget *)local_870);
    std::__cxx11::string::string
              ((string *)&local_530,"try_compile_dummy_exe",(allocator *)&local_8e8);
    cmTarget::SetType((cmTarget *)local_870,EXECUTABLE,(string *)&local_530);
    std::__cxx11::string::~string((string *)&local_530);
    cmTarget::SetMakefile((cmTarget *)local_870,tgt->Target->Makefile);
    pcVar3 = cmGeneratorTarget::GetLocalGenerator(tgt);
    cmGeneratorTarget::cmGeneratorTarget(&local_530,(cmTarget *)local_870,pcVar3);
    this_00.x_ = local_8f8.x_;
    pcVar3 = cmGeneratorTarget::GetLocalGenerator(tgt);
    local_8e8._M_dataplus._M_p = (pointer)&local_8e8.field_2;
    local_8e8._M_string_length = 0;
    local_8e8.field_2._M_local_buf[0] = '\0';
    pcVar2 = cmCompiledGeneratorExpression::Evaluate
                       (this_00.x_,pcVar3,&this->Config,false,&local_530,tgt,&local_5f8,&local_8e8);
    __return_storage_ptr__ = local_8f0;
    std::__cxx11::string::string((string *)local_8f0,pcVar2,&local_8f9);
    std::__cxx11::string::~string((string *)&local_8e8);
    psVar1 = &(local_8f8.x_)->AllTargetsSeen;
    for (p_Var4 = ((local_8f8.x_)->AllTargetsSeen)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left;
        (_Rb_tree_header *)p_Var4 != &(psVar1->_M_t)._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      pVar5 = std::
              _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
              ::_M_insert_unique<cmGeneratorTarget_const*const&>
                        ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                          *)emitted,(cmGeneratorTarget **)(p_Var4 + 1));
      if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
        push_back(&this->Exports,(value_type *)(p_Var4 + 1));
      }
    }
    cmGeneratorTarget::~cmGeneratorTarget(&local_530);
    cmTarget::~cmTarget((cmTarget *)local_870);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_8f8);
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&local_5f8);
    cmGeneratorExpression::~cmGeneratorExpression(&local_8c8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportTryCompileFileGenerator::FindTargets(
                                  const std::string& propName,
                                  cmGeneratorTarget const* tgt,
                                  std::set<cmGeneratorTarget const*> &emitted)
{
  const char *prop = tgt->GetProperty(propName);
  if(!prop)
    {
    return std::string();
    }

  cmGeneratorExpression ge;

  cmGeneratorExpressionDAGChecker dagChecker(
                                      tgt->GetName(),
                                      propName, 0, 0);

  cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(prop);

  cmTarget dummyHead;
  dummyHead.SetType(cmState::EXECUTABLE, "try_compile_dummy_exe");
  dummyHead.SetMakefile(tgt->Target->GetMakefile());

  cmGeneratorTarget gDummyHead(&dummyHead, tgt->GetLocalGenerator());

  std::string result = cge->Evaluate(tgt->GetLocalGenerator(), this->Config,
                                     false, &gDummyHead,
                                     tgt, &dagChecker);

  const std::set<cmGeneratorTarget const*> &allTargets =
      cge->GetAllTargetsSeen();
  for(std::set<cmGeneratorTarget const*>::const_iterator li =
      allTargets.begin(); li != allTargets.end(); ++li)
    {
    if(emitted.insert(*li).second)
      {
      this->Exports.push_back(*li);
      }
    }
  return result;
}